

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::at_nocase(JSONNode *this,json_string *name_t)

{
  JSONNode **ppJVar1;
  out_of_range *this_00;
  string *psVar2;
  JSONNode **res;
  json_string *name_t_local;
  JSONNode *this_local;
  
  ppJVar1 = internalJSONNode::at_nocase(this->internal,name_t);
  if (ppJVar1 != (JSONNode **)0x0) {
    return *ppJVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar2 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar2);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("at_nocase"));
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return *(*res);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("at_nocase const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }